

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

char * __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::AllocDecommitPages<BVStatic<272ul>,false>
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,uint pageCount,
          BVStatic<272UL> freePages,BVStatic<272UL> decommitPages)

{
  PageBitVector *this_00;
  PageBitVector *this_01;
  ulong *puVar1;
  SecondaryAllocator *pSVar2;
  PageAllocatorBaseCommon *pPVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BVIndex BVar7;
  uint uVar8;
  int iVar9;
  BVIndex BVar10;
  uint uVar11;
  undefined4 *puVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  AllocatorType *pAVar16;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_02;
  char *lpAddress;
  undefined1 auStack_98 [8];
  BVStatic<272UL> freeAndDecommitPages;
  uintptr_t mask;
  
  BVar10 = this->freePageCount;
  this_00 = &this->freePages;
  BVar7 = BVStatic<272UL>::Count(this_00);
  if (BVar10 != BVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x192,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar5) goto LAB_00705ea1;
    *puVar12 = 0;
  }
  BVar10 = this->decommitPageCount;
  this_01 = &this->decommitPages;
  BVar7 = BVStatic<272UL>::Count(this_01);
  if (BVar10 != BVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x193,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                       "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
    if (!bVar5) goto LAB_00705ea1;
    *puVar12 = 0;
  }
  uVar8 = this->decommitPageCount;
  if (uVar8 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x194,"(decommitPageCount != 0)","decommitPageCount != 0");
    if (!bVar5) goto LAB_00705ea1;
    *puVar12 = 0;
    uVar8 = this->decommitPageCount;
  }
  if (pageCount <= uVar8 + this->freePageCount) {
    pSVar2 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).secondaryAllocator;
    if ((pSVar2 != (SecondaryAllocator *)0x0) &&
       (iVar9 = (*pSVar2->_vptr_SecondaryAllocator[3])(), (char)iVar9 == '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x199,
                         "(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate())"
                         ,
                         "this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate()"
                        );
      if (!bVar5) {
LAB_00705ea1:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar12 = 0;
    }
    freeAndDecommitPages.data[3] = freePages.data[4];
    freeAndDecommitPages.data[1] = freePages.data[2];
    freeAndDecommitPages.data[2] = freePages.data[3];
    auStack_98 = (undefined1  [8])freePages.data[0].word;
    freeAndDecommitPages.data[0] = freePages.data[1];
    lVar15 = 0;
    do {
      puVar1 = (ulong *)((long)(freeAndDecommitPages.data + -1) + lVar15);
      *puVar1 = *puVar1 | *(ulong *)((long)&decommitPages.data[0].word + lVar15);
      lVar15 = lVar15 + 8;
    } while (lVar15 != 0x28);
    uVar8 = this->freePageCount;
    BVar10 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_98,0);
    if (BVar10 != 0xffffffff) {
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar13 = (ulong)pageCount * 0x1000;
      do {
        pPVar3 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                 allocator;
        pAVar16 = &pPVar3[-1].allocatorType;
        if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
          pAVar16 = (AllocatorType *)0x0;
        }
        if (pAVar16[0x28] <= BVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x1a3,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                             "index < this->GetAllocator()->GetMaxAllocPageCount()");
          if (!bVar5) goto LAB_00705ea1;
          *puVar12 = 0;
        }
        uVar11 = GetAvailablePageCount(this);
        if (uVar11 - BVar10 < pageCount) {
          return (char *)0x0;
        }
        if ((pageCount == 1) ||
           (BVar6 = BVStatic<272UL>::TestRange((BVStatic<272UL> *)auStack_98,BVar10,pageCount),
           BVar6 != '\0')) {
          lpAddress = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address +
                      (BVar10 << 0xc);
          if ((uVar13 - 1 & (ulong)lpAddress) == 0) {
            pPVar3 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                     allocator;
            this_02 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       *)&pPVar3[-1].allocatorType;
            if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
              this_02 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                         *)0x0;
            }
            PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
            ::GetVirtualAllocator(this_02);
            pPVar3 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                     allocator;
            pAVar16 = &pPVar3[-1].allocatorType;
            if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
              pAVar16 = (AllocatorType *)0x0;
            }
            pcVar14 = (char *)VirtualAllocWrapper::AllocPages
                                        ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,
                                         lpAddress,(ulong)pageCount,0x1000,4,pAVar16[0x50] == 2);
            if (pcVar14 == (char *)0x0) {
              if (pageCount == 1) {
                return (char *)0x0;
              }
              goto LAB_00705d1f;
            }
            if (pcVar14 != lpAddress) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x1be,"(ret == pages)","ret == pages");
              if (!bVar5) goto LAB_00705ea1;
              *puVar12 = 0;
            }
            BVStatic<272UL>::ClearRange(this_00,BVar10,pageCount);
            BVStatic<272UL>::ClearRange(this_01,BVar10,pageCount);
            BVar10 = BVStatic<272UL>::Count(this_00);
            BVar7 = (this->freePageCount - uVar8) + BVar10;
            this->freePageCount = BVar7;
            this->decommitPageCount = this->decommitPageCount + (uVar8 - (BVar10 + pageCount));
            BVar10 = BVStatic<272UL>::Count(this_00);
            if (BVar7 != BVar10) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x1c7,"(freePageCount == (uint)this->GetCountOfFreePages())",
                                 "freePageCount == (uint)this->GetCountOfFreePages()");
              if (!bVar5) goto LAB_00705ea1;
              *puVar12 = 0;
            }
            BVar10 = this->decommitPageCount;
            BVar7 = BVStatic<272UL>::Count(this_01);
            if (BVar10 == BVar7) {
              return lpAddress;
            }
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x1c8,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())"
                               ,"decommitPageCount == (uint)this->GetCountOfDecommitPages()");
            if (bVar5) {
              *puVar12 = 0;
              return lpAddress;
            }
            goto LAB_00705ea1;
          }
          BVar10 = BVar10 + (int)((ulong)lpAddress % uVar13 >> 0xc);
          pPVar3 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
                   allocator;
          pAVar16 = &pPVar3[-1].allocatorType;
          if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
            pAVar16 = (AllocatorType *)0x0;
          }
          if (pAVar16[0x28] <= BVar10) {
            return (char *)0x0;
          }
        }
        else {
LAB_00705d1f:
          BVar10 = BVar10 + 1;
        }
        BVar10 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_98,BVar10);
      } while (BVar10 != 0xffffffff);
    }
  }
  return (char *)0x0;
}

Assistant:

char *
PageSegmentBase<TVirtualAlloc>::AllocDecommitPages(uint pageCount, T freePages, T decommitPages)
{
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    Assert(decommitPageCount ==  (uint)this->GetCountOfDecommitPages());
    Assert(decommitPageCount != 0);
    if (freePageCount + decommitPageCount < pageCount)
    {
        return nullptr;
    }
    Assert(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate());

    T freeAndDecommitPages = freePages;

    freeAndDecommitPages.Or(&decommitPages);

    uint oldFreePageCount = freePageCount;
    uint index = freeAndDecommitPages.GetNextBit(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || freeAndDecommitPages.TestRange(index, pageCount))
        {
            char * pages = this->address + index * AutoSystemInfo::PageSize;

            if (!notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(pages, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = freeAndDecommitPages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            void * ret = this->GetAllocator()->GetVirtualAllocator()->AllocPages(pages, pageCount, MEM_COMMIT, PAGE_READWRITE, this->IsInCustomHeapAllocator());
            if (ret != nullptr)
            {
                Assert(ret == pages);

                this->ClearRangeInFreePagesBitVector(index, pageCount);
                this->ClearRangeInDecommitPagesBitVector(index, pageCount);

                uint newFreePageCount = this->GetCountOfFreePages();
                freePageCount = freePageCount - oldFreePageCount + newFreePageCount;
                decommitPageCount -= pageCount - (oldFreePageCount - newFreePageCount);

                Assert(freePageCount == (uint)this->GetCountOfFreePages());
                Assert(decommitPageCount == (uint)this->GetCountOfDecommitPages());

                return pages;
            }
            else if (pageCount == 1)
            {
                // if we failed to commit one page, we should just give up.
                return nullptr;
            }
        }
        index = freeAndDecommitPages.GetNextBit(index + 1);
    }

    return nullptr;
}